

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

StreamIn * prvTidyUserInput(TidyDocImpl *doc,TidyInputSource *source,int encoding)

{
  StreamIn *pSVar1;
  StreamIn *in;
  int encoding_local;
  TidyInputSource *source_local;
  TidyDocImpl *doc_local;
  
  pSVar1 = prvTidyinitStreamIn(doc,encoding);
  (pSVar1->source).sourceData = source->sourceData;
  (pSVar1->source).getByte = source->getByte;
  (pSVar1->source).ungetByte = source->ungetByte;
  (pSVar1->source).eof = source->eof;
  pSVar1->iotype = UserIO;
  return pSVar1;
}

Assistant:

StreamIn* TY_(UserInput)( TidyDocImpl* doc, TidyInputSource* source, int encoding )
{
    StreamIn *in = TY_(initStreamIn)( doc, encoding );
    memcpy( &in->source, source, sizeof(TidyInputSource) );
    in->iotype = UserIO;
    return in;
}